

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O2

void demo_prepare(demo *demo)

{
  uint32_t *puVar1;
  VkDescriptorSetLayout *ppVVar2;
  float fVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  VkSwapchainKHR pVVar8;
  undefined4 uVar10;
  VkImage pVVar9;
  undefined4 uVar11;
  undefined4 uVar12;
  _Bool _Var13;
  VkResult VVar14;
  VkPresentModeKHR *__ptr;
  VkImage *ppVVar15;
  SwapchainBuffers *pSVar16;
  VkShaderModule pVVar17;
  VkFramebuffer *ppVVar18;
  long lVar19;
  long lVar20;
  undefined8 *puVar21;
  VkImageViewCreateInfo *pVVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  VkImageViewCreateInfo view;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  undefined4 uStack_304;
  uint32_t presentModeCount;
  VkDeviceSize VStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  VkSamplerCreateInfo sampler;
  VkAttachmentReference depth_reference;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineVertexInputStateCreateInfo vi;
  VkCommandPoolCreateInfo cmd_pool_info;
  VkCommandBufferAllocateInfo cmd;
  VkDynamicState dynamicStateEnables [9];
  VkPipelineCacheCreateInfo pipelineCache;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  VkPipelineViewportStateCreateInfo vp;
  
  bVar25 = 0;
  cmd_pool_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmd_pool_info.pNext = (void *)0x0;
  cmd_pool_info.flags = 2;
  cmd_pool_info.queueFamilyIndex = demo->graphics_queue_node_index;
  VVar14 = (*glad_vkCreateCommandPool)
                     (demo->device,&cmd_pool_info,(VkAllocationCallbacks *)0x0,&demo->cmd_pool);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x5ac,"void demo_prepare(struct demo *)");
  }
  cmd.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmd.pNext = (void *)0x0;
  cmd.commandPool = demo->cmd_pool;
  cmd.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmd.commandBufferCount = 1;
  VVar14 = (*glad_vkAllocateCommandBuffers)(demo->device,&cmd,&demo->draw_cmd);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x5b6,"void demo_prepare(struct demo *)");
  }
  pVVar8 = demo->swapchain;
  VVar14 = (*glad_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                     (demo->gpu,demo->surface,&surfCapabilities);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x24b,"void demo_prepare_buffers(struct demo *)");
  }
  VVar14 = (*glad_vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (demo->gpu,demo->surface,&presentModeCount,(VkPresentModeKHR *)0x0);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x250,"void demo_prepare_buffers(struct demo *)");
  }
  __ptr = (VkPresentModeKHR *)malloc(((ulong)_presentModeCount & 0xffffffff) << 2);
  if (__ptr == (VkPresentModeKHR *)0x0) {
    __assert_fail("presentModes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x253,"void demo_prepare_buffers(struct demo *)");
  }
  VVar14 = (*glad_vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (demo->gpu,demo->surface,&presentModeCount,__ptr);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x256,"void demo_prepare_buffers(struct demo *)");
  }
  if (surfCapabilities.currentExtent.width == 0xffffffff) {
    fVar3 = (float)demo->width;
    uVar4 = demo->height;
    surfCapabilities.currentExtent.width = surfCapabilities.maxImageExtent.width;
    if ((uint)fVar3 < surfCapabilities.maxImageExtent.width) {
      surfCapabilities.currentExtent.width = (uint32_t)fVar3;
    }
    if ((uint)fVar3 < surfCapabilities.minImageExtent.width) {
      surfCapabilities.currentExtent.width = surfCapabilities.minImageExtent.width;
    }
    sampler.anisotropyEnable = surfCapabilities.minImageExtent.height;
    if ((surfCapabilities.minImageExtent.height <= uVar4) &&
       (sampler.anisotropyEnable = surfCapabilities.maxImageExtent.height,
       uVar4 < surfCapabilities.maxImageExtent.height)) {
      sampler.anisotropyEnable = uVar4;
    }
  }
  else {
    demo->width = surfCapabilities.currentExtent.width;
    demo->height = surfCapabilities.currentExtent.height;
    sampler.anisotropyEnable = surfCapabilities.currentExtent.height;
  }
  sampler.addressModeU = surfCapabilities.maxImageCount;
  if (surfCapabilities.minImageCount < surfCapabilities.maxImageCount) {
    sampler.addressModeU = surfCapabilities.minImageCount;
  }
  if (surfCapabilities.maxImageCount == 0) {
    sampler.addressModeU = surfCapabilities.minImageCount;
  }
  sampler.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  sampler.pNext = (void *)0x0;
  sampler._16_8_ = (ulong)sampler.magFilter << 0x20;
  sampler.minFilter = (VkFilter)demo->surface;
  sampler.mipmapMode = (VkSamplerMipmapMode)((ulong)demo->surface >> 0x20);
  uVar5 = demo->format;
  uVar10 = demo->color_space;
  sampler.maxAnisotropy = 1.4013e-45;
  sampler.compareEnable = 0x10;
  sampler.compareOp = VK_COMPARE_OP_NEVER;
  sampler.minLod = 0.0;
  sampler.borderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
  sampler.unnormalizedCoordinates = 0;
  sampler.addressModeV = uVar5;
  sampler.addressModeW = uVar10;
  sampler.mipLodBias = (float)surfCapabilities.currentExtent.width;
  VVar14 = (*glad_vkCreateSwapchainKHR)
                     (demo->device,(VkSwapchainCreateInfoKHR *)&sampler,(VkAllocationCallbacks *)0x0
                      ,&demo->swapchain);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2a2,"void demo_prepare_buffers(struct demo *)");
  }
  if (pVVar8 != (VkSwapchainKHR)0x0) {
    (*glad_vkDestroySwapchainKHR)(demo->device,pVVar8,(VkAllocationCallbacks *)0x0);
  }
  puVar1 = &demo->swapchainImageCount;
  VVar14 = (*glad_vkGetSwapchainImagesKHR)(demo->device,demo->swapchain,puVar1,(VkImage *)0x0);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2ae,"void demo_prepare_buffers(struct demo *)");
  }
  ppVVar15 = (VkImage *)malloc((ulong)*puVar1 << 3);
  if (ppVVar15 == (VkImage *)0x0) {
    __assert_fail("swapchainImages",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2b2,"void demo_prepare_buffers(struct demo *)");
  }
  VVar14 = (*glad_vkGetSwapchainImagesKHR)(demo->device,demo->swapchain,puVar1,ppVVar15);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2b6,"void demo_prepare_buffers(struct demo *)");
  }
  uVar23 = (ulong)demo->swapchainImageCount;
  pSVar16 = (SwapchainBuffers *)malloc(uVar23 * 0x18);
  demo->buffers = pSVar16;
  if (pSVar16 == (SwapchainBuffers *)0x0) {
    __assert_fail("demo->buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x2ba,"void demo_prepare_buffers(struct demo *)");
  }
  lVar20 = 0x10;
  for (uVar24 = 0; uVar24 < uVar23; uVar24 = uVar24 + 1) {
    view.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    view.pNext = (void *)0x0;
    view.flags = 0;
    view.subresourceRange.layerCount = 1;
    view.format = demo->format;
    view.viewType = VK_IMAGE_VIEW_TYPE_2D;
    view.components.r = VK_COMPONENT_SWIZZLE_R;
    view.components.g = VK_COMPONENT_SWIZZLE_G;
    view.components.b = VK_COMPONENT_SWIZZLE_B;
    view.components.a = VK_COMPONENT_SWIZZLE_A;
    view.subresourceRange.aspectMask = 1;
    view.subresourceRange.baseMipLevel = 0;
    view.subresourceRange.levelCount = 1;
    view.subresourceRange.baseArrayLayer = 0;
    pVVar9 = ppVVar15[uVar24];
    pSVar16 = demo->buffers;
    *(VkImage *)((long)pSVar16 + lVar20 + -0x10) = pVVar9;
    view.image._0_4_ = SUB84(pVVar9,0);
    view.image._4_4_ = (undefined4)((ulong)pVVar9 >> 0x20);
    VVar14 = (*glad_vkCreateImageView)
                       (demo->device,&view,(VkAllocationCallbacks *)0x0,
                        (VkImageView *)((long)&pSVar16->image + lVar20));
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x2d7,"void demo_prepare_buffers(struct demo *)");
    }
    uVar23 = (ulong)*puVar1;
    lVar20 = lVar20 + 0x18;
  }
  demo->current_buffer = 0;
  free(__ptr);
  sampler.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  sampler.pNext = (void *)0x0;
  sampler.flags = 0;
  sampler.magFilter = VK_FILTER_LINEAR;
  sampler.minFilter = 0x7c;
  uVar6 = demo->width;
  uVar11 = demo->height;
  sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
  sampler.addressModeW = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
  sampler.mipLodBias = 1.4013e-45;
  sampler.anisotropyEnable = 1;
  sampler.maxAnisotropy = 0.0;
  sampler.compareEnable = 0x20;
  sampler.compareOp = VK_COMPARE_OP_NEVER;
  sampler.minLod = 0.0;
  sampler.borderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
  sampler.unnormalizedCoordinates = 0;
  surfCapabilities.minImageExtent.width = 0;
  surfCapabilities.minImageExtent.height = 0;
  surfCapabilities.maxImageExtent.width = 0;
  surfCapabilities.maxImageExtent.height = 0;
  surfCapabilities.minImageCount = 5;
  surfCapabilities.maxImageCount = 0;
  surfCapabilities.currentExtent.width = 0;
  surfCapabilities.currentExtent.height = 0;
  view.pNext = (void *)0x0;
  view.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
  view.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
  view.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
  view.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  view.subresourceRange.baseArrayLayer = 0;
  view._76_4_ = 0;
  view.flags = 0;
  view._20_4_ = 0;
  view.image._0_4_ = 0;
  view.image._4_4_ = 0;
  view.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  view._4_4_ = 0;
  view.viewType = VK_IMAGE_VIEW_TYPE_2D;
  view.format = VK_FORMAT_D16_UNORM;
  view.subresourceRange.aspectMask = 2;
  view.subresourceRange.baseMipLevel = 0;
  view.subresourceRange.levelCount = 1;
  (demo->depth).format = VK_FORMAT_D16_UNORM;
  view.subresourceRange.layerCount = view.subresourceRange.levelCount;
  sampler.mipmapMode = uVar6;
  sampler.addressModeU = uVar11;
  VVar14 = (*glad_vkCreateImage)
                     (demo->device,(VkImageCreateInfo *)&sampler,(VkAllocationCallbacks *)0x0,
                      &(demo->depth).image);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x30c,"void demo_prepare_depth(struct demo *)");
  }
  (*glad_vkGetImageMemoryRequirements)
            (demo->device,(demo->depth).image,(VkMemoryRequirements *)&presentModeCount);
  surfCapabilities.minImageExtent = _presentModeCount;
  _Var13 = memory_type_from_properties
                     (demo,(uint32_t)local_2c8,0,&surfCapabilities.maxImageExtent.width);
  if (!_Var13) {
    __assert_fail("pass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x316,"void demo_prepare_depth(struct demo *)");
  }
  VVar14 = (*glad_vkAllocateMemory)
                     (demo->device,(VkMemoryAllocateInfo *)&surfCapabilities,
                      (VkAllocationCallbacks *)0x0,&(demo->depth).mem);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x31a,"void demo_prepare_depth(struct demo *)");
  }
  VVar14 = (*glad_vkBindImageMemory)(demo->device,(demo->depth).image,(demo->depth).mem,0);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,799,"void demo_prepare_depth(struct demo *)");
  }
  demo_set_image_layout
            (demo,(demo->depth).image,2,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0);
  pVVar9 = (demo->depth).image;
  view.image._0_4_ = SUB84(pVVar9,0);
  view.image._4_4_ = (undefined4)((ulong)pVVar9 >> 0x20);
  VVar14 = (*glad_vkCreateImageView)
                     (demo->device,&view,(VkAllocationCallbacks *)0x0,&(demo->depth).view);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x329,"void demo_prepare_depth(struct demo *)");
  }
  _presentModeCount = (VkExtent2D)&DAT_ff00ff00ffff0000;
  (*glad_vkGetPhysicalDeviceFormatProperties)
            (demo->gpu,VK_FORMAT_B8G8R8A8_UNORM,(VkFormatProperties *)&surfCapabilities);
  if (((surfCapabilities._0_8_ & 1) == 0) || (demo->use_staging_buffer != false)) {
    if ((surfCapabilities._0_8_ & 0x100000000) == 0) {
      __assert_fail("!\"No support for B8G8R8A8_UNORM as texture image format\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x3d8,"void demo_prepare_textures(struct demo *)");
    }
    view.viewType = VK_IMAGE_VIEW_TYPE_1D;
    view.format = VK_FORMAT_UNDEFINED;
    view.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
    view.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
    view.flags = 0;
    view._20_4_ = 0;
    view.image._0_4_ = 0;
    view.image._4_4_ = 0;
    view.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    view._4_4_ = 0;
    view.pNext = (void *)0x0;
    demo_prepare_texture_image
              (demo,&presentModeCount,(texture_object *)&view,VK_IMAGE_TILING_LINEAR,1,6);
    demo_prepare_texture_image(demo,&presentModeCount,demo->textures,VK_IMAGE_TILING_OPTIMAL,6,1);
    demo_set_image_layout
              (demo,(VkImage)view.pNext,1,view.flags,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,0);
    demo_set_image_layout
              (demo,demo->textures[0].image,1,demo->textures[0].imageLayout,
               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0);
    sampler.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    sampler._4_4_ = 0;
    sampler.pNext = (void *)0x100000000;
    sampler.flags = 0;
    sampler.magFilter = VK_FILTER_NEAREST;
    sampler.minFilter = VK_FILTER_NEAREST;
    sampler.mipmapMode = VK_SAMPLER_MIPMAP_MODE_LINEAR;
    sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    sampler.addressModeW = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
    sampler.mipLodBias = 0.0;
    sampler.anisotropyEnable = 0;
    sampler.maxAnisotropy = 0.0;
    sampler.compareEnable = view.components.r;
    sampler.compareOp = view.components.g;
    sampler.minLod = 1.4013e-45;
    (*glad_vkCmdCopyImage)
              (demo->setup_cmd,(VkImage)view.pNext,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
               demo->textures[0].image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,
               (VkImageCopy *)&sampler);
    demo_set_image_layout
              (demo,demo->textures[0].image,1,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
               demo->textures[0].imageLayout,0);
    demo_flush_init_cmd(demo);
    (*glad_vkDestroyImage)(demo->device,(VkImage)view.pNext,(VkAllocationCallbacks *)0x0);
    (*glad_vkFreeMemory)
              (demo->device,(VkDeviceMemory)CONCAT44(view.image._4_4_,view.image._0_4_),
               (VkAllocationCallbacks *)0x0);
  }
  else {
    demo_prepare_texture_image(demo,&presentModeCount,demo->textures,VK_IMAGE_TILING_LINEAR,4,6);
  }
  sampler.pNext = (void *)0x0;
  sampler.anisotropyEnable = 0;
  sampler.compareEnable = 0;
  sampler.compareOp = VK_COMPARE_OP_NEVER;
  sampler.minLod = 0.0;
  sampler.maxLod = 0.0;
  sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  sampler.addressModeW = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  sampler.mipLodBias = 0.0;
  sampler.flags = 0;
  sampler.magFilter = VK_FILTER_NEAREST;
  sampler.minFilter = VK_FILTER_NEAREST;
  sampler.mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  sampler.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  sampler._4_4_ = 0;
  sampler.maxAnisotropy = 1.0;
  sampler.borderColor = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
  sampler.unnormalizedCoordinates = 0;
  puVar21 = &DAT_00122ec0;
  pVVar22 = &view;
  for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
    *(undefined8 *)pVVar22 = *puVar21;
    puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
    pVVar22 = (VkImageViewCreateInfo *)((long)pVVar22 + (ulong)bVar25 * -0x10 + 8);
  }
  VVar14 = (*glad_vkCreateSampler)
                     (demo->device,&sampler,(VkAllocationCallbacks *)0x0,&demo->textures[0].sampler)
  ;
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x3ff,"void demo_prepare_textures(struct demo *)");
  }
  pVVar9 = demo->textures[0].image;
  view.image._0_4_ = SUB84(pVVar9,0);
  view.image._4_4_ = (undefined4)((ulong)pVVar9 >> 0x20);
  VVar14 = (*glad_vkCreateImageView)
                     (demo->device,&view,(VkAllocationCallbacks *)0x0,&demo->textures[0].view);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x405,"void demo_prepare_textures(struct demo *)");
  }
  sampler.pNext = (void *)0x0;
  sampler.flags = 0;
  sampler.magFilter = VK_FILTER_NEAREST;
  sampler.anisotropyEnable = 0;
  sampler.maxAnisotropy = 0.0;
  sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  sampler.addressModeW = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  sampler.mipLodBias = 0.0;
  sampler.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  sampler._4_4_ = 0;
  sampler.minFilter = 0x3c;
  sampler.mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  sampler.addressModeU = 0x80;
  view.flags = 0;
  view._20_4_ = 0;
  view.image._0_4_ = 0;
  view.image._4_4_ = 0;
  view.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  view._4_4_ = 0;
  view.pNext = (void *)0x0;
  (demo->vertices).vi_attrs[1].binding = 0;
  (demo->vertices).vi_attrs[1].format = VK_FORMAT_UNDEFINED;
  *(undefined8 *)&(demo->vertices).vi_attrs[1].offset = 0;
  (demo->vertices).vi_attrs[0].binding = 0;
  (demo->vertices).vi_attrs[0].format = VK_FORMAT_UNDEFINED;
  *(undefined8 *)&(demo->vertices).vi_attrs[0].offset = 0;
  (demo->vertices).vi_bindings[0].binding = 0;
  (demo->vertices).vi_bindings[0].stride = 0;
  *(undefined8 *)&(demo->vertices).vi_bindings[0].inputRate = 0;
  *(undefined8 *)&(demo->vertices).vi.vertexAttributeDescriptionCount = 0;
  (demo->vertices).vi.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  (demo->vertices).vi.flags = 0;
  (demo->vertices).vi.vertexBindingDescriptionCount = 0;
  (demo->vertices).vi.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  *(undefined8 *)&(demo->vertices).vi = 0;
  (demo->vertices).vi.pNext = (void *)0x0;
  (demo->vertices).buf = (VkBuffer)0x0;
  (demo->vertices).mem = (VkDeviceMemory)0x0;
  VVar14 = (*glad_vkCreateBuffer)
                     (demo->device,(VkBufferCreateInfo *)&sampler,(VkAllocationCallbacks *)0x0,
                      &(demo->vertices).buf);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x427,"void demo_prepare_vertices(struct demo *)");
  }
  (*glad_vkGetBufferMemoryRequirements)
            (demo->device,(demo->vertices).buf,(VkMemoryRequirements *)&surfCapabilities);
  view.flags = surfCapabilities.minImageCount;
  view._20_4_ = surfCapabilities.maxImageCount;
  _Var13 = memory_type_from_properties
                     (demo,surfCapabilities.minImageExtent.width,6,(uint32_t *)&view.image);
  if (!_Var13) {
    __assert_fail("pass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x431,"void demo_prepare_vertices(struct demo *)");
  }
  VVar14 = (*glad_vkAllocateMemory)
                     (demo->device,(VkMemoryAllocateInfo *)&view,(VkAllocationCallbacks *)0x0,
                      &(demo->vertices).mem);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x434,"void demo_prepare_vertices(struct demo *)");
  }
  VVar14 = (*glad_vkMapMemory)(demo->device,(demo->vertices).mem,0,CONCAT44(view._20_4_,view.flags),
                               0,(void **)&presentModeCount);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x438,"void demo_prepare_vertices(struct demo *)");
  }
  *(undefined8 *)((long)_presentModeCount + 0x2c) = 0x3f8000003f800000;
  *(undefined8 *)((long)_presentModeCount + 0x34) = 0x3f8000003f000000;
  *(undefined8 *)((long)_presentModeCount + 0x20) = 0x3f800000;
  *(undefined8 *)((long)_presentModeCount + 0x28) = 0x3f80000000000000;
  *(undefined8 *)((long)_presentModeCount + 0x10) = 0x3f80000000000000;
  *(undefined8 *)((long)_presentModeCount + 0x18) = 0x3e800000bf800000;
  *(undefined8 *)_presentModeCount = 0xbf800000bf800000;
  *(undefined8 *)((long)_presentModeCount + 8) = 0x3e800000;
  (*glad_vkUnmapMemory)(demo->device,(demo->vertices).mem);
  VVar14 = (*glad_vkBindBufferMemory)(demo->device,(demo->vertices).buf,(demo->vertices).mem,0);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x440,"void demo_prepare_vertices(struct demo *)");
  }
  (demo->vertices).vi.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  (demo->vertices).vi.pNext = (void *)0x0;
  (demo->vertices).vi.vertexBindingDescriptionCount = 1;
  (demo->vertices).vi.pVertexBindingDescriptions = (demo->vertices).vi_bindings;
  (demo->vertices).vi.vertexAttributeDescriptionCount = 2;
  (demo->vertices).vi.pVertexAttributeDescriptions = (demo->vertices).vi_attrs;
  (demo->vertices).vi_bindings[0].binding = 0;
  (demo->vertices).vi_bindings[0].stride = 0x14;
  *(undefined8 *)&(demo->vertices).vi_bindings[0].inputRate = 0;
  (demo->vertices).vi_attrs[1].binding = 0;
  (demo->vertices).vi_attrs[0].binding = 0;
  (demo->vertices).vi_attrs[0].format = VK_FORMAT_R32G32B32_SFLOAT;
  *(undefined8 *)&(demo->vertices).vi_attrs[0].offset = 0x100000000;
  (demo->vertices).vi_attrs[1].format = VK_FORMAT_R32G32_SFLOAT;
  (demo->vertices).vi_attrs[1].offset = 0xc;
  surfCapabilities.minImageExtent.width = 0;
  surfCapabilities.minImageExtent.height = 0;
  surfCapabilities.minImageCount = 0;
  surfCapabilities.maxImageCount = 1;
  surfCapabilities.currentExtent.width = 1;
  surfCapabilities.currentExtent.height = 0x10;
  view.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  view.pNext = (void *)0x0;
  view.flags = 0;
  view._20_4_ = 1;
  ppVVar2 = &demo->desc_layout;
  view.image = (VkImage)&surfCapabilities;
  VVar14 = (*glad_vkCreateDescriptorSetLayout)
                     (demo->device,(VkDescriptorSetLayoutCreateInfo *)&view,
                      (VkAllocationCallbacks *)0x0,ppVVar2);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x46b,"void demo_prepare_descriptor_layout(struct demo *)");
  }
  sampler.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  sampler.pNext = (void *)0x0;
  sampler.flags = 0;
  sampler.magFilter = VK_FILTER_LINEAR;
  sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  sampler.addressModeW = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  sampler.mipLodBias = 0.0;
  sampler._24_8_ = ppVVar2;
  VVar14 = (*glad_vkCreatePipelineLayout)
                     (demo->device,(VkPipelineLayoutCreateInfo *)&sampler,
                      (VkAllocationCallbacks *)0x0,&demo->pipeline_layout);
  if (VVar14 == VK_SUCCESS) {
    sampler._4_4_ = demo->format;
    sampler.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    sampler.pNext = (void *)0x100000001;
    sampler.flags = 0;
    sampler.magFilter = 2;
    sampler.minFilter = VK_FILTER_LINEAR;
    sampler.mipmapMode = 2;
    sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    sampler.addressModeW = (demo->depth).format;
    sampler.mipLodBias = 1.4013e-45;
    sampler.anisotropyEnable = 1;
    sampler.maxAnisotropy = 1.4013e-45;
    sampler.compareEnable = 2;
    sampler.compareOp = VK_COMPARE_OP_LESS;
    sampler.minLod = 4.2039e-45;
    sampler.maxLod = 4.2039e-45;
    view.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    view._4_4_ = 0;
    view.components._8_8_ = &depth_reference;
    view.pNext = (void *)((ulong)view.pNext & 0xffffffff00000000);
    view.flags = 0;
    view._20_4_ = 0;
    view.image._0_4_ = 1;
    view.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
    view.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
    view.subresourceRange._0_8_ = view.subresourceRange._0_8_ & 0xffffffff00000000;
    view.subresourceRange.levelCount = 0;
    view.subresourceRange.baseArrayLayer = 0;
    surfCapabilities.minImageCount = 0x26;
    surfCapabilities.currentExtent.width = 0;
    surfCapabilities.currentExtent.height = 0;
    surfCapabilities.minImageExtent.width = 0;
    surfCapabilities.minImageExtent.height = 2;
    surfCapabilities.maxImageArrayLayers = 1;
    stack0xfffffffffffffcf8 = stack0xfffffffffffffcf8 & 0xffffffff00000000;
    _presentModeCount = (VkExtent2D)0x200000000;
    depth_reference.attachment = 1;
    depth_reference.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
    view._32_8_ = &presentModeCount;
    surfCapabilities.maxImageExtent = (VkExtent2D)&sampler;
    surfCapabilities._40_8_ = &view;
    VVar14 = (*glad_vkCreateRenderPass)
                       (demo->device,(VkRenderPassCreateInfo *)&surfCapabilities,
                        (VkAllocationCallbacks *)0x0,&demo->render_pass);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x4b4,"void demo_prepare_render_pass(struct demo *)");
    }
    memset(&sampler,0,0x90);
    sampler.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
    vi.sType = (demo->vertices).vi.sType;
    vi._4_4_ = *(undefined4 *)&(demo->vertices).vi.field_0x4;
    vi.pNext = (demo->vertices).vi.pNext;
    vi.flags = (demo->vertices).vi.flags;
    vi.vertexBindingDescriptionCount = (demo->vertices).vi.vertexBindingDescriptionCount;
    vi.pVertexBindingDescriptions = (demo->vertices).vi.pVertexBindingDescriptions;
    vi.vertexAttributeDescriptionCount = (demo->vertices).vi.vertexAttributeDescriptionCount;
    vi._36_4_ = *(undefined4 *)&(demo->vertices).vi.field_0x24;
    vi.pVertexAttributeDescriptions = (demo->vertices).vi.pVertexAttributeDescriptions;
    ia.pNext = (void *)0x0;
    ia.primitiveRestartEnable = 0;
    ia._28_4_ = 0;
    ia.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
    ia._4_4_ = 0;
    view.image._4_4_ = 3;
    ia.flags = 0;
    ia.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    VStack_2d0 = 0;
    uStack_2b0 = 0;
    local_2a8 = 0;
    local_2c8._0_4_ = 0;
    local_2c8._4_4_ = 0;
    uStack_2c0 = 0;
    _presentModeCount = (VkExtent2D)0x17;
    local_2b8 = 0x100000002;
    uStack_2a0 = 0x3f800000;
    depth_reference.attachment = 0x1a;
    depth_reference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
    vp.pScissors = (VkRect2D *)0x0;
    vp.pViewports = (VkViewport *)0x0;
    vp.pNext = (void *)0x0;
    vp.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
    vp._4_4_ = 0;
    vp.flags = 0;
    vp.viewportCount = 1;
    vp.scissorCount = 1;
    vp._36_4_ = 0;
    view.subresourceRange.baseArrayLayer = 0;
    view.subresourceRange.layerCount = 0;
    view._76_4_ = 0;
    view.viewType = VK_IMAGE_VIEW_TYPE_1D;
    view.format = VK_FORMAT_UNDEFINED;
    view.flags = 0;
    view.pNext = (void *)0x0;
    view.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
    view._4_4_ = 0;
    view._20_4_ = 1;
    view.image._0_4_ = 1;
    view.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
    view.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
    view.subresourceRange.aspectMask = 0;
    view.subresourceRange.baseMipLevel = 0;
    view.subresourceRange.levelCount = 0;
    view.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
    view.components.a = VK_COMPONENT_SWIZZLE_A|VK_COMPONENT_SWIZZLE_ZERO;
    local_78 = 0;
    uStack_70 = 0;
    uStack_80 = 0;
    uStack_90 = 0;
    local_98 = 0x18;
    local_88 = 0x100000000;
    sampler.magFilter = 2;
    surfCapabilities.currentExtent.width = 0;
    surfCapabilities.currentExtent.height = 0;
    surfCapabilities.maxImageExtent.width = 0;
    surfCapabilities.maxImageExtent.height = 0;
    surfCapabilities.supportedUsageFlags = 0;
    uStack_304 = 0;
    surfCapabilities.maxImageArrayLayers = 0;
    surfCapabilities.supportedTransforms = 0;
    surfCapabilities.currentTransform = 0;
    surfCapabilities.supportedCompositeAlpha = 0;
    surfCapabilities.minImageCount = 0x12;
    surfCapabilities.maxImageCount = 0;
    surfCapabilities.minImageExtent.width = 0;
    surfCapabilities.minImageExtent.height = 1;
    surfCapabilities.maxImageExtent =
         (VkExtent2D)demo_prepare_shader_module(demo,vertShaderCode,0x2f0);
    demo->vert_shader_module = (VkShaderModule)surfCapabilities.maxImageExtent;
    surfCapabilities._32_8_ = anon_var_dwarf_55d;
    surfCapabilities.supportedUsageFlags = 0x12;
    pVVar17 = demo_prepare_shader_module(demo,fragShaderCode,0x274);
    demo->frag_shader_module = pVVar17;
    sampler._32_8_ = &vi;
    sampler._40_8_ = &ia;
    sampler._64_8_ = &presentModeCount;
    pipelineCache.pNext = (void *)0x0;
    pipelineCache.flags = 0;
    pipelineCache._20_4_ = 0;
    pipelineCache.initialDataSize = 0;
    pipelineCache.pInitialData = (void *)0x0;
    pipelineCache.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
    pipelineCache._4_4_ = 0;
    sampler._72_8_ = &local_98;
    sampler._56_8_ = &vp;
    sampler._24_8_ = &surfCapabilities;
    VVar14 = (*glad_vkCreatePipelineCache)
                       (demo->device,&pipelineCache,(VkAllocationCallbacks *)0x0,
                        &demo->pipelineCache);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x546,"void demo_prepare_pipeline(struct demo *)");
    }
    VVar14 = (*glad_vkCreateGraphicsPipelines)
                       (demo->device,demo->pipelineCache,1,(VkGraphicsPipelineCreateInfo *)&sampler,
                        (VkAllocationCallbacks *)0x0,&demo->pipeline);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x549,"void demo_prepare_pipeline(struct demo *)");
    }
    (*glad_vkDestroyPipelineCache)(demo->device,demo->pipelineCache,(VkAllocationCallbacks *)0x0);
    (*glad_vkDestroyShaderModule)
              (demo->device,demo->frag_shader_module,(VkAllocationCallbacks *)0x0);
    (*glad_vkDestroyShaderModule)
              (demo->device,demo->vert_shader_module,(VkAllocationCallbacks *)0x0);
    sampler.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
    sampler.pNext = (void *)0x0;
    view.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    view._4_4_ = 1;
    sampler.flags = 0;
    sampler.magFilter = VK_FILTER_LINEAR;
    sampler.minFilter = VK_FILTER_LINEAR;
    sampler._32_8_ = &view;
    VVar14 = (*glad_vkCreateDescriptorPool)
                       (demo->device,(VkDescriptorPoolCreateInfo *)&sampler,
                        (VkAllocationCallbacks *)0x0,&demo->desc_pool);
    if (VVar14 == VK_SUCCESS) {
      view.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
      view.pNext = (void *)0x0;
      view.flags = (VkImageViewCreateFlags)demo->desc_pool;
      view._20_4_ = SUB84((ulong)demo->desc_pool >> 0x20,0);
      view.image._0_4_ = 1;
      view._32_8_ = ppVVar2;
      VVar14 = (*glad_vkAllocateDescriptorSets)
                         (demo->device,(VkDescriptorSetAllocateInfo *)&view,&demo->desc_set);
      if (VVar14 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x571,"void demo_prepare_descriptor_set(struct demo *)");
      }
      surfCapabilities.minImageExtent.width = 1;
      surfCapabilities.minImageExtent.height = 0;
      surfCapabilities._0_8_ = demo->textures[0].sampler;
      surfCapabilities.currentExtent = (VkExtent2D)demo->textures[0].view;
      sampler.pNext = (void *)0x0;
      sampler.minFilter = VK_FILTER_NEAREST;
      sampler.mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
      sampler.anisotropyEnable = 0;
      sampler.maxAnisotropy = 0.0;
      sampler.compareEnable = 0;
      sampler.compareOp = VK_COMPARE_OP_NEVER;
      sampler.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
      sampler._4_4_ = 0;
      sampler._16_8_ = demo->desc_set;
      sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
      sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
      sampler._40_8_ = &surfCapabilities;
      (*glad_vkUpdateDescriptorSets)
                (demo->device,1,(VkWriteDescriptorSet *)&sampler,0,(VkCopyDescriptorSet *)0x0);
      view.pNext = (demo->depth).view;
      sampler.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      sampler.pNext = (void *)0x0;
      sampler._16_8_ = sampler._16_8_ & 0xffffffff00000000;
      sampler.minFilter = (VkFilter)demo->render_pass;
      sampler.mipmapMode = (VkSamplerMipmapMode)((ulong)demo->render_pass >> 0x20);
      sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      uVar7 = demo->width;
      uVar12 = demo->height;
      sampler.compareEnable = 1;
      sampler.anisotropyEnable = uVar7;
      sampler.maxAnisotropy = (float)uVar12;
      sampler._40_8_ = &view;
      ppVVar18 = (VkFramebuffer *)malloc((ulong)demo->swapchainImageCount << 3);
      demo->framebuffers = ppVVar18;
      if (ppVVar18 != (VkFramebuffer *)0x0) {
        lVar20 = 2;
        uVar23 = 0xffffffffffffffff;
        lVar19 = 0;
        do {
          uVar23 = uVar23 + 1;
          if (*puVar1 <= uVar23) {
            return;
          }
          view._0_8_ = (&demo->buffers->image)[lVar20];
          lVar20 = lVar20 + 3;
          VVar14 = (*glad_vkCreateFramebuffer)
                             (demo->device,(VkFramebufferCreateInfo *)&sampler,
                              (VkAllocationCallbacks *)0x0,
                              (VkFramebuffer *)(lVar19 + (long)demo->framebuffers));
          lVar19 = lVar19 + 8;
        } while (VVar14 == VK_SUCCESS);
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x59d,"void demo_prepare_framebuffers(struct demo *)");
      }
      __assert_fail("demo->framebuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x597,"void demo_prepare_framebuffers(struct demo *)");
    }
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,0x561,"void demo_prepare_descriptor_pool(struct demo *)");
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                ,0x476,"void demo_prepare_descriptor_layout(struct demo *)");
}

Assistant:

static void demo_prepare(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;

    const VkCommandPoolCreateInfo cmd_pool_info = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
        .pNext = NULL,
        .queueFamilyIndex = demo->graphics_queue_node_index,
        .flags = VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,
    };
    err = vkCreateCommandPool(demo->device, &cmd_pool_info, NULL,
                              &demo->cmd_pool);
    assert(!err);

    const VkCommandBufferAllocateInfo cmd = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
        .pNext = NULL,
        .commandPool = demo->cmd_pool,
        .level = VK_COMMAND_BUFFER_LEVEL_PRIMARY,
        .commandBufferCount = 1,
    };
    err = vkAllocateCommandBuffers(demo->device, &cmd, &demo->draw_cmd);
    assert(!err);

    demo_prepare_buffers(demo);
    demo_prepare_depth(demo);
    demo_prepare_textures(demo);
    demo_prepare_vertices(demo);
    demo_prepare_descriptor_layout(demo);
    demo_prepare_render_pass(demo);
    demo_prepare_pipeline(demo);

    demo_prepare_descriptor_pool(demo);
    demo_prepare_descriptor_set(demo);

    demo_prepare_framebuffers(demo);
}